

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

matrix4d *
tinyusdz::GetLocalTransform
          (matrix4d *__return_storage_ptr__,Prim *prim,bool *resetXformStack,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  long lVar3;
  matrix4d *pmVar4;
  byte bVar5;
  bool rxs;
  double local_b8;
  Xformable *xformable;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  
  bVar5 = 0;
  local_b8 = t;
  bVar1 = IsXformablePrim(prim);
  if (bVar1) {
    if (resetXformStack != (bool *)0x0) {
      *resetXformStack = false;
    }
    xformable = (Xformable *)0x0;
    bVar1 = CastToXformable(prim,&xformable);
    if ((bVar1) && (xformable != (Xformable *)0x0)) {
      rxs = false;
      Xformable::GetLocalMatrix_abi_cxx11_(&ret,xformable,local_b8,tinterp,&rxs);
      if (ret.contained.
          super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        if (resetXformStack != (bool *)0x0) {
          *resetXformStack = rxs;
        }
        pvVar2 = nonstd::expected_lite::
                 expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        pmVar4 = __return_storage_ptr__;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          pmVar4->m[0][0] = pvVar2->m[0][0];
          pvVar2 = (value_type *)((long)pvVar2 + ((ulong)bVar5 * -2 + 1) * 8);
          pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar5 * -2 + 1) * 8);
        }
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected(&ret);
        return __return_storage_ptr__;
      }
      nonstd::expected_lite::
      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
  }
  else if (resetXformStack != (bool *)0x0) {
    *resetXformStack = false;
  }
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d GetLocalTransform(const Prim &prim, bool *resetXformStack,
                                  double t,
                                  value::TimeSampleInterpolationType tinterp) {
  if (!IsXformablePrim(prim)) {
    if (resetXformStack) {
      (*resetXformStack) = false;
    }
    return value::matrix4d::identity();
  }

  // default false
  if (resetXformStack) {
    (*resetXformStack) = false;
  }

  const Xformable *xformable{nullptr};
  if (CastToXformable(prim, &xformable)) {
    if (!xformable) {
      return value::matrix4d::identity();
    }

    value::matrix4d m;
    bool rxs{false};
    nonstd::expected<value::matrix4d, std::string> ret =
        xformable->GetLocalMatrix(t, tinterp, &rxs);
    if (ret) {
      if (resetXformStack) {
        (*resetXformStack) = rxs;
      }
      return ret.value();
    }
  }

  return value::matrix4d::identity();
}